

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.h
# Opt level: O0

void __thiscall adios2::Utils::~Utils(Utils *this)

{
  code *pcVar1;
  Utils *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~Utils() = default;